

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TIntermAggregate * __thiscall
glslang::HlslParseContext::assignClipCullDistance
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,int semanticId,TIntermTyped *left,
          TIntermTyped *right)

{
  EShLanguage EVar1;
  TVector<glslang::TArraySize> *pTVar2;
  TIntermediate *pTVar3;
  uint i;
  TSourceLoc *loc_00;
  bool bVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  long lVar12;
  TIntermTyped *base;
  undefined4 extraout_var_00;
  ulong uVar13;
  undefined4 extraout_var_01;
  TSmallArrayVector *pTVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined8 *puVar15;
  TPoolAllocator *this_00;
  TArraySizes *this_01;
  long *plVar16;
  TVariable *pTVar17;
  TIntermSymbol *base_00;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  TIntermConstantUnion *pTVar18;
  TIntermSymbol *pTVar19;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  TIntermTyped *base_01;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  TIntermTyped *pTVar20;
  TIntermAggregate *left_00;
  TIntermTyped *right_00;
  uint uVar21;
  TQualifier *pTVar22;
  uint *puVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  byte bVar28;
  array<int,_2UL> semanticOffset;
  TType clipCullType;
  uint local_14c;
  uint local_144;
  uint local_138;
  int local_110;
  uint local_e8 [2];
  ulong local_e0;
  TSourceLoc *local_d8;
  long local_d0;
  TType local_c8;
  undefined4 extraout_var_06;
  
  bVar28 = 0;
  EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
  if ((EVar1 < EShLangCompute) && ((0x19U >> (EVar1 & 0x1f) & 1) != 0)) {
    iVar7 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
    lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x58))
                       ((long *)CONCAT44(extraout_var,iVar7));
    uVar21 = (*(uint *)(lVar12 + 8) >> 7 & 0x1ff) - 0x21;
    base = left;
    pTVar20 = right;
    if (uVar21 < 2) {
      base = right;
      pTVar20 = left;
    }
    iVar7 = (*(pTVar20->super_TIntermNode)._vptr_TIntermNode[0x21])();
    uVar8 = *(uint *)(CONCAT44(extraout_var_00,iVar7) + 8) >> 7 & 0x1ff;
    local_d8 = loc;
    if (uVar8 == 0x22) {
      uVar25 = (ulong)(uVar21 >= 2) << 4 | 0x908;
      uVar13 = (ulong)(uVar21 < 2) << 4 | 0x928;
    }
    else {
      if (uVar8 != 0x21) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                      ,0xa53,
                      "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                     );
      }
      uVar25 = (ulong)(uVar21 >= 2) << 4 | 0x900;
      uVar13 = (ulong)(uVar21 < 2) << 4 | 0x920;
    }
    lVar12 = 0;
    uVar8 = 0;
    iVar7 = 0;
    puVar23 = local_e8;
    bVar4 = true;
    do {
      bVar26 = bVar4;
      iVar10 = *(int *)((long)&(this->super_TParseContextBase).super_TParseVersions.
                               _vptr_TParseVersions + lVar12 * 4 + uVar13);
      uVar24 = uVar8 + 3 & 0xfffffffc;
      iVar11 = 0;
      if (iVar10 + iVar7 < 5) {
        uVar24 = uVar8;
        iVar11 = iVar7;
      }
      *puVar23 = uVar24;
      iVar7 = iVar11 + iVar10;
      uVar8 = uVar24 + iVar10;
      lVar12 = 1;
      puVar23 = local_e8 + 1;
      bVar4 = false;
    } while (bVar26);
    iVar7 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
    pTVar14 = (TSmallArrayVector *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x98))
                        ((long *)CONCAT44(extraout_var_01,iVar7));
    iVar7 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
    cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar7) + 0xe8))
                      ((long *)CONCAT44(extraout_var_02,iVar7));
    uVar13 = 0;
    if ((cVar5 != '\0') && (pTVar2 = pTVar14->sizes, pTVar2 != (TVector<glslang::TArraySize> *)0x0))
    {
      uVar13 = (ulong)((long)(pTVar2->
                             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ).
                             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pTVar2->
                            super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                            ).
                            super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4;
    }
    iVar7 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x60))
                      ((long *)CONCAT44(extraout_var_03,iVar7));
    local_144 = 1;
    iVar10 = (int)uVar13;
    if (iVar10 < 1) {
      bVar4 = false;
      local_14c = 1;
    }
    else {
      local_14c = TSmallArrayVector::getDimSize(pTVar14,iVar10 + -1);
      if (iVar10 == 1) {
        bVar4 = false;
      }
      else {
        local_144 = TSmallArrayVector::getDimSize(pTVar14,0);
        bVar4 = true;
      }
    }
    bVar26 = uVar21 < 2;
    bVar27 = (this->super_TParseContextBase).super_TParseVersions.language != EShLangGeometry;
    pTVar17 = *(TVariable **)
               ((long)&(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions +
               uVar25);
    local_e0 = uVar13;
    if (pTVar17 == (TVariable *)0x0) {
      uVar9 = 1;
      uVar24 = 1;
      if (bVar4 || (bVar27 || bVar26)) {
        uVar24 = local_14c;
      }
      if (0 < iVar10) {
        uVar9 = TSmallArrayVector::getDimSize(pTVar14,0);
      }
      iVar10 = (*(pTVar20->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar20);
      lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar10) + 0x58))
                         ((long *)CONCAT44(extraout_var_04,iVar10));
      TType::TType(&local_c8,EbtFloat,*(TStorageQualifier *)(lVar12 + 8) & 0x7f,1,0,0,false);
      iVar10 = (*(pTVar20->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar20);
      puVar15 = (undefined8 *)
                (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar10) + 0x58))
                          ((long *)CONCAT44(extraout_var_05,iVar10));
      pTVar22 = &local_c8.qualifier;
      for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
        pTVar22->semanticName = (char *)*puVar15;
        puVar15 = puVar15 + (ulong)bVar28 * -2 + 1;
        pTVar22 = (TQualifier *)((long)pTVar22 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      this_00 = GetThreadPoolAllocator();
      this_01 = (TArraySizes *)TPoolAllocator::allocate(this_00,0x18);
      (this_01->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00af64d8;
      (this_01->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
      this_01->implicitArraySize = 0;
      this_01->implicitlySized = true;
      this_01->variablyIndexed = false;
      if (!bVar27 && !bVar26) {
        TSmallArrayVector::push_back((TSmallArrayVector *)this_01,uVar9,(TIntermTyped *)0x0);
      }
      TSmallArrayVector::push_back((TSmallArrayVector *)this_01,uVar24 * uVar8,(TIntermTyped *)0x0);
      local_c8.arraySizes = this_01;
      iVar10 = (*(pTVar20->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar20);
      plVar16 = (long *)CONCAT44(extraout_var_06,iVar10);
      if (plVar16 == (long *)0x0) {
        __assert_fail("sym != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                      ,0xa96,
                      "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                     );
      }
      local_c8.qualifier._28_2_ = local_c8.qualifier._28_2_ | 0xfff;
      lVar12 = (**(code **)(*plVar16 + 400))(plVar16);
      pTVar17 = makeInternalVariable(this,*(char **)(lVar12 + 8),&local_c8);
      *(TVariable **)
       ((long)&(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions + uVar25) =
           pTVar17;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,pTVar17);
      pTVar17 = *(TVariable **)
                 ((long)&(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions +
                 uVar25);
    }
    base_00 = TIntermediate::addSymbol
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,pTVar17);
    iVar10 = (*(base_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base_00);
    iVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar10) + 0x60))
                       ((long *)CONCAT44(extraout_var_07,iVar10));
    iVar11 = (*(base_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base_00);
    pTVar14 = (TSmallArrayVector *)
              (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar11) + 0x98))
                        ((long *)CONCAT44(extraout_var_08,iVar11));
    uVar8 = 1;
    if (!bVar27 && !bVar26) {
      uVar8 = TSmallArrayVector::getDimSize(pTVar14,0);
    }
    uVar24 = TSmallArrayVector::getDimSize(pTVar14,(uint)(!bVar27 && !bVar26));
    iVar11 = (*(base_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base_00);
    cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar11) + 0xe8))
                      ((long *)CONCAT44(extraout_var_09,iVar11));
    loc_00 = local_d8;
    if (cVar5 == '\0') {
      __assert_fail("clipCullSym->getType().isArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xaaf,
                    "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                   );
    }
    iVar11 = (*(base_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base_00);
    iVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar11) + 0x60))
                       ((long *)CONCAT44(extraout_var_10,iVar11));
    if (iVar11 != 1) {
      __assert_fail("clipCullSym->getType().getVectorSize() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xab0,
                    "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                   );
    }
    iVar11 = (*(base_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base_00);
    iVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar11) + 0x38))
                       ((long *)CONCAT44(extraout_var_11,iVar11));
    if (iVar11 != 1) {
      __assert_fail("clipCullSym->getType().getBasicType() == EbtFloat",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xab1,
                    "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                   );
    }
    iVar11 = (*(base_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base_00);
    cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar11) + 0xe8))
                      ((long *)CONCAT44(extraout_var_12,iVar11));
    iVar11 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar11) + 0xe8))
                      ((long *)CONCAT44(extraout_var_13,iVar11));
    if ((((iVar10 == iVar7) && (uVar8 == local_144)) && (uVar24 == local_14c)) && (cVar5 == cVar6))
    {
      pTVar19 = base_00;
      if (uVar21 < 2) {
        pTVar19 = (TIntermSymbol *)right;
        left = &base_00->super_TIntermTyped;
      }
      pTVar20 = TIntermediate::addAssign
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,op,left
                           ,&pTVar19->super_TIntermTyped,loc_00);
      left_00 = TIntermediate::growAggregate
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           (TIntermNode *)0x0,&pTVar20->super_TIntermNode);
    }
    else {
      if ((int)local_144 < 1) {
LAB_0040da15:
        __assert_fail("assignList != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                      ,0xb09,
                      "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                     );
      }
      local_d0 = (long)semanticId;
      uVar8 = local_e8[semanticId];
      uVar9 = 0;
      local_110 = 0;
      left_00 = (TIntermAggregate *)0x0;
      do {
        if (0 < (int)local_14c) {
          local_138 = 0;
          do {
            if (0 < iVar7) {
              iVar10 = 0;
              i = uVar8;
              do {
                pTVar19 = base_00;
                if (!bVar27 && !bVar26) {
                  iVar11 = (*(base_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e]
                           )(base_00);
                  TType::TType(&local_c8,(TType *)CONCAT44(extraout_var_14,iVar11),0,false);
                  pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                  pTVar18 = TIntermediate::addConstantUnion(pTVar3,local_110,loc_00,false);
                  pTVar19 = (TIntermSymbol *)
                            TIntermediate::addIndex
                                      (pTVar3,EOpIndexDirect,&base_00->super_TIntermTyped,
                                       &pTVar18->super_TIntermTyped,loc_00);
                  (*(pTVar19->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
                            (pTVar19,&local_c8);
                }
                uVar8 = i + 1;
                iVar11 = (*(pTVar19->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                   (pTVar19);
                TType::TType(&local_c8,(TType *)CONCAT44(extraout_var_15,iVar11),0,false);
                pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                pTVar18 = TIntermediate::addConstantUnion(pTVar3,i,loc_00,false);
                pTVar20 = TIntermediate::addIndex
                                    (pTVar3,EOpIndexDirect,&pTVar19->super_TIntermTyped,
                                     &pTVar18->super_TIntermTyped,loc_00);
                (*(pTVar20->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar20,&local_c8);
                if ((int)uVar24 <= (int)uVar8 && (!bVar27 && !bVar26)) {
                  uVar8 = local_e8[local_d0];
                  local_110 = local_110 + 1;
                }
                base_01 = base;
                if (bVar4) {
                  iVar11 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
                  TType::TType(&local_c8,(TType *)CONCAT44(extraout_var_16,iVar11),0,false);
                  pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                  pTVar18 = TIntermediate::addConstantUnion(pTVar3,uVar9,loc_00,false);
                  base_01 = TIntermediate::addIndex
                                      (pTVar3,EOpIndexDirect,base,&pTVar18->super_TIntermTyped,
                                       loc_00);
                  (*(base_01->super_TIntermNode)._vptr_TIntermNode[0x1d])(base_01,&local_c8);
                }
                if (0 < (int)local_e0) {
                  iVar11 = (*(base_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(base_01);
                  TType::TType(&local_c8,(TType *)CONCAT44(extraout_var_17,iVar11),0,false);
                  pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                  pTVar18 = TIntermediate::addConstantUnion(pTVar3,local_138,loc_00,false);
                  base_01 = TIntermediate::addIndex
                                      (pTVar3,EOpIndexDirect,base_01,&pTVar18->super_TIntermTyped,
                                       loc_00);
                  (*(base_01->super_TIntermNode)._vptr_TIntermNode[0x1d])(base_01,&local_c8);
                }
                iVar11 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
                cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar11) + 0xd8))
                                  ((long *)CONCAT44(extraout_var_18,iVar11));
                if (cVar5 != '\0') {
                  iVar11 = (*(base_01->super_TIntermNode)._vptr_TIntermNode[0x1e])(base_01);
                  TType::TType(&local_c8,(TType *)CONCAT44(extraout_var_19,iVar11),0,false);
                  pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                  pTVar18 = TIntermediate::addConstantUnion(pTVar3,iVar10,loc_00,false);
                  base_01 = TIntermediate::addIndex
                                      (pTVar3,EOpIndexDirect,base_01,&pTVar18->super_TIntermTyped,
                                       loc_00);
                  (*(base_01->super_TIntermNode)._vptr_TIntermNode[0x1d])(base_01,&local_c8);
                }
                right_00 = pTVar20;
                if (uVar21 < 2) {
                  right_00 = base_01;
                  base_01 = pTVar20;
                }
                pTVar20 = TIntermediate::addAssign
                                    ((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate,op,base_01,right_00,loc_00);
                left_00 = TIntermediate::growAggregate
                                    ((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate,(TIntermNode *)left_00,&pTVar20->super_TIntermNode
                                    );
                iVar10 = iVar10 + 1;
                i = uVar8;
              } while (iVar7 != iVar10);
            }
            local_138 = local_138 + 1;
          } while (local_138 != local_14c);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != local_144);
      if (left_00 == (TIntermAggregate *)0x0) goto LAB_0040da15;
    }
    (*(left_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
              (left_00,1);
  }
  else {
    left_00 = (TIntermAggregate *)0x0;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unimplemented: clip/cull not currently implemented for this stage","","");
  }
  return left_00;
}

Assistant:

TIntermAggregate* HlslParseContext::assignClipCullDistance(const TSourceLoc& loc, TOperator op, int semanticId,
                                                           TIntermTyped* left, TIntermTyped* right)
{
    switch (language) {
    case EShLangFragment:
    case EShLangVertex:
    case EShLangGeometry:
        break;
    default:
        error(loc, "unimplemented: clip/cull not currently implemented for this stage", "", "");
        return nullptr;
    }

    TVariable** clipCullVar = nullptr;

    // Figure out if we are assigning to, or from, clip or cull distance.
    const bool isOutput = isClipOrCullDistance(left->getType());

    // This is the rvalue or lvalue holding the clip or cull distance.
    TIntermTyped* clipCullNode = isOutput ? left : right;
    // This is the value going into or out of the clip or cull distance.
    TIntermTyped* internalNode = isOutput ? right : left;

    const TBuiltInVariable builtInType = clipCullNode->getQualifier().builtIn;

    decltype(clipSemanticNSizeIn)* semanticNSize = nullptr;

    // Refer to either the clip or the cull distance, depending on semantic.
    switch (builtInType) {
    case EbvClipDistance:
        clipCullVar = isOutput ? &clipDistanceOutput : &clipDistanceInput;
        semanticNSize = isOutput ? &clipSemanticNSizeOut : &clipSemanticNSizeIn;
        break;
    case EbvCullDistance:
        clipCullVar = isOutput ? &cullDistanceOutput : &cullDistanceInput;
        semanticNSize = isOutput ? &cullSemanticNSizeOut : &cullSemanticNSizeIn;
        break;

    // called invalidly: we expected a clip or a cull distance.
    // static compile time problem: should not happen.
    default: assert(0); return nullptr;
    }

    // This is the offset in the destination array of a given semantic's data
    std::array<int, maxClipCullRegs> semanticOffset;

    // Calculate offset of variable of semantic N in destination array
    int arrayLoc = 0;
    int vecItems = 0;

    for (int x = 0; x < maxClipCullRegs; ++x) {
        // See if we overflowed the vec4 packing
        if ((vecItems + (*semanticNSize)[x]) > 4) {
            arrayLoc = (arrayLoc + 3) & (~0x3); // round up to next multiple of 4
            vecItems = 0;
        }

        semanticOffset[x] = arrayLoc;
        vecItems += (*semanticNSize)[x];
        arrayLoc += (*semanticNSize)[x];
    }


    // It can have up to 2 array dimensions (in the case of geometry shader inputs)
    const TArraySizes* const internalArraySizes = internalNode->getType().getArraySizes();
    const int internalArrayDims = internalNode->getType().isArray() ? internalArraySizes->getNumDims() : 0;
    // vector sizes:
    const int internalVectorSize = internalNode->getType().getVectorSize();
    // array sizes, or 1 if it's not an array:
    const int internalInnerArraySize = (internalArrayDims > 0 ? internalArraySizes->getDimSize(internalArrayDims-1) : 1);
    const int internalOuterArraySize = (internalArrayDims > 1 ? internalArraySizes->getDimSize(0) : 1);

    // The created type may be an array of arrays, e.g, for geometry shader inputs.
    const bool isImplicitlyArrayed = (language == EShLangGeometry && !isOutput);

    // If we haven't created the output already, create it now.
    if (*clipCullVar == nullptr) {
        // ClipDistance and CullDistance are handled specially in the entry point input/output copy
        // algorithm, because they may need to be unpacked from components of vectors (or a scalar)
        // into a float array, or vice versa.  Here, we make the array the right size and type,
        // which depends on the incoming data, which has several potential dimensions:
        //    * Semantic ID
        //    * vector size
        //    * array size
        // Of those, semantic ID and array size cannot appear simultaneously.
        //
        // Also to note: for implicitly arrayed forms (e.g, geometry shader inputs), we need to create two
        // array dimensions.  The shader's declaration may have one or two array dimensions.  One is always
        // the geometry's dimension.

        const bool useInnerSize = internalArrayDims > 1 || !isImplicitlyArrayed;

        const int requiredInnerArraySize = arrayLoc * (useInnerSize ? internalInnerArraySize : 1);
        const int requiredOuterArraySize = (internalArrayDims > 0) ? internalArraySizes->getDimSize(0) : 1;

        TType clipCullType(EbtFloat, clipCullNode->getType().getQualifier().storage, 1);
        clipCullType.getQualifier() = clipCullNode->getType().getQualifier();

        // Create required array dimension
        TArraySizes* arraySizes = new TArraySizes;
        if (isImplicitlyArrayed)
            arraySizes->addInnerSize(requiredOuterArraySize);
        arraySizes->addInnerSize(requiredInnerArraySize);
        clipCullType.transferArraySizes(arraySizes);

        // Obtain symbol name: we'll use that for the symbol we introduce.
        TIntermSymbol* sym = clipCullNode->getAsSymbolNode();
        assert(sym != nullptr);

        // We are moving the semantic ID from the layout location, so it is no longer needed or
        // desired there.
        clipCullType.getQualifier().layoutLocation = TQualifier::layoutLocationEnd;

        // Create variable and track its linkage
        *clipCullVar = makeInternalVariable(sym->getName().c_str(), clipCullType);

        trackLinkage(**clipCullVar);
    }

    // Create symbol for the clip or cull variable.
    TIntermSymbol* clipCullSym = intermediate.addSymbol(**clipCullVar);

    // vector sizes:
    const int clipCullVectorSize = clipCullSym->getType().getVectorSize();

    // array sizes, or 1 if it's not an array:
    const TArraySizes* const clipCullArraySizes = clipCullSym->getType().getArraySizes();
    const int clipCullOuterArraySize = isImplicitlyArrayed ? clipCullArraySizes->getDimSize(0) : 1;
    const int clipCullInnerArraySize = clipCullArraySizes->getDimSize(isImplicitlyArrayed ? 1 : 0);

    // clipCullSym has got to be an array of scalar floats, per SPIR-V semantics.
    // fixBuiltInIoType() should have handled that upstream.
    assert(clipCullSym->getType().isArray());
    assert(clipCullSym->getType().getVectorSize() == 1);
    assert(clipCullSym->getType().getBasicType() == EbtFloat);

    // We may be creating multiple sub-assignments.  This is an aggregate to hold them.
    // TODO: it would be possible to be clever sometimes and avoid the sequence node if not needed.
    TIntermAggregate* assignList = nullptr;

    // Holds individual component assignments as we make them.
    TIntermTyped* clipCullAssign = nullptr;

    // If the types are homomorphic, use a simple assign.  No need to mess about with
    // individual components.
    if (clipCullSym->getType().isArray() == internalNode->getType().isArray() &&
        clipCullInnerArraySize == internalInnerArraySize &&
        clipCullOuterArraySize == internalOuterArraySize &&
        clipCullVectorSize == internalVectorSize) {

        if (isOutput)
            clipCullAssign = intermediate.addAssign(op, clipCullSym, internalNode, loc);
        else
            clipCullAssign = intermediate.addAssign(op, internalNode, clipCullSym, loc);

        assignList = intermediate.growAggregate(assignList, clipCullAssign);
        assignList->setOperator(EOpSequence);

        return assignList;
    }

    // We are going to copy each component of the internal (per array element if indicated) to sequential
    // array elements of the clipCullSym.  This tracks the lhs element we're writing to as we go along.
    // We may be starting in the middle - e.g, for a non-zero semantic ID calculated above.
    int clipCullInnerArrayPos = semanticOffset[semanticId];
    int clipCullOuterArrayPos = 0;

    // Lambda to add an index to a node, set the type of the result, and return the new node.
    const auto addIndex = [this, &loc](TIntermTyped* node, int pos) -> TIntermTyped* {
        const TType derefType(node->getType(), 0);
        node = intermediate.addIndex(EOpIndexDirect, node, intermediate.addConstantUnion(pos, loc), loc);
        node->setType(derefType);
        return node;
    };

    // Loop through every component of every element of the internal, and copy to or from the matching external.
    for (int internalOuterArrayPos = 0; internalOuterArrayPos < internalOuterArraySize; ++internalOuterArrayPos) {
        for (int internalInnerArrayPos = 0; internalInnerArrayPos < internalInnerArraySize; ++internalInnerArrayPos) {
            for (int internalComponent = 0; internalComponent < internalVectorSize; ++internalComponent) {
                // clip/cull array member to read from / write to:
                TIntermTyped* clipCullMember = clipCullSym;

                // If implicitly arrayed, there is an outer array dimension involved
                if (isImplicitlyArrayed)
                    clipCullMember = addIndex(clipCullMember, clipCullOuterArrayPos);

                // Index into proper array position for clip cull member
                clipCullMember = addIndex(clipCullMember, clipCullInnerArrayPos++);

                // if needed, start over with next outer array slice.
                if (isImplicitlyArrayed && clipCullInnerArrayPos >= clipCullInnerArraySize) {
                    clipCullInnerArrayPos = semanticOffset[semanticId];
                    ++clipCullOuterArrayPos;
                }

                // internal member to read from / write to:
                TIntermTyped* internalMember = internalNode;

                // If internal node has outer array dimension, index appropriately.
                if (internalArrayDims > 1)
                    internalMember = addIndex(internalMember, internalOuterArrayPos);

                // If internal node has inner array dimension, index appropriately.
                if (internalArrayDims > 0)
                    internalMember = addIndex(internalMember, internalInnerArrayPos);

                // If internal node is a vector, extract the component of interest.
                if (internalNode->getType().isVector())
                    internalMember = addIndex(internalMember, internalComponent);

                // Create an assignment: output from internal to clip cull, or input from clip cull to internal.
                if (isOutput)
                    clipCullAssign = intermediate.addAssign(op, clipCullMember, internalMember, loc);
                else
                    clipCullAssign = intermediate.addAssign(op, internalMember, clipCullMember, loc);

                // Track assignment in the sequence.
                assignList = intermediate.growAggregate(assignList, clipCullAssign);
            }
        }
    }

    assert(assignList != nullptr);
    assignList->setOperator(EOpSequence);

    return assignList;
}